

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedBreakIterator::RuleBasedBreakIterator
          (RuleBasedBreakIterator *this,UnicodeString *rules,UParseError *parseError,
          UErrorCode *status)

{
  RuleBasedBreakIterator *that;
  UnicodeString local_68;
  
  BreakIterator::BreakIterator(&this->super_BreakIterator);
  (this->super_BreakIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedBreakIterator_003f7780;
  local_68.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00401be0;
  local_68.fUnion.fStackFields.fLengthAndFlags = 2;
  StringCharacterIterator::StringCharacterIterator(&this->fSCharIter,&local_68);
  UnicodeString::~UnicodeString(&local_68);
  init(this,(EVP_PKEY_CTX *)status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    that = (RuleBasedBreakIterator *)
           RBBIRuleBuilder::createRuleBasedBreakIterator(rules,parseError,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      operator=(this,that);
      (*(that->super_BreakIterator).super_UObject._vptr_UObject[1])(that);
    }
  }
  return;
}

Assistant:

RuleBasedBreakIterator::RuleBasedBreakIterator( const UnicodeString  &rules,
                                                UParseError          &parseError,
                                                UErrorCode           &status)
 : fSCharIter(UnicodeString())
{
    init(status);
    if (U_FAILURE(status)) {return;}
    RuleBasedBreakIterator *bi = (RuleBasedBreakIterator *)
        RBBIRuleBuilder::createRuleBasedBreakIterator(rules, &parseError, status);
    // Note:  This is a bit awkward.  The RBBI ruleBuilder has a factory method that
    //        creates and returns a complete RBBI.  From here, in a constructor, we
    //        can't just return the object created by the builder factory, hence
    //        the assignment of the factory created object to "this".
    if (U_SUCCESS(status)) {
        *this = *bi;
        delete bi;
    }
}